

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O2

void fy_emit_common_node_preamble
               (fy_emitter *emit,fy_token *fyt_anchor,fy_token *fyt_tag,int flags,int indent)

{
  fy_emitter_cfg_flags fVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  size_t tag_len;
  size_t anchor_len;
  size_t td_handle_size;
  size_t td_prefix_size;
  
  tag_len = 0;
  anchor_len = 0;
  fVar1 = emit->cfg->flags;
  if ((fVar1 & 0xf00000) != FYECF_MODE_JSON_ONELINE && (fVar1 & 0xe00000) != FYECF_MODE_JSON) {
    if (fyt_anchor == (fy_token *)0x0 || (char)((fVar1 & FYECF_STRIP_LABELS) >> 2) != '\0') {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = fy_token_get_text(fyt_anchor,&anchor_len);
      fVar1 = emit->cfg->flags;
    }
    pcVar3 = (char *)0x0;
    if ((fyt_tag != (fy_token *)0x0) && ((fVar1 & FYECF_STRIP_TAGS) == FYECF_DOC_END_MARK_AUTO)) {
      pcVar3 = fy_token_get_text(fyt_tag,&tag_len);
    }
    if (pcVar2 != (char *)0x0) {
      fy_emit_write_indicator(emit,di_ambersand,flags,indent,fyewt_anchor);
      fy_emit_write(emit,fyewt_anchor,pcVar2,(int)anchor_len);
    }
    if (pcVar3 != (char *)0x0) {
      if ((emit->flags & 1) == 0) {
        fy_emit_write_ws(emit);
      }
      pcVar2 = fy_tag_token_get_directive_handle(fyt_tag,&td_handle_size);
      if (pcVar2 == (char *)0x0) {
        __assert_fail("td_handle",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-emit.c"
                      ,0x237,
                      "void fy_emit_common_node_preamble(struct fy_emitter *, struct fy_token *, struct fy_token *, int, int)"
                     );
      }
      pcVar4 = fy_tag_token_get_directive_prefix(fyt_tag,&td_prefix_size);
      if (pcVar4 == (char *)0x0) {
        __assert_fail("td_prefix",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-emit.c"
                      ,0x239,
                      "void fy_emit_common_node_preamble(struct fy_emitter *, struct fy_token *, struct fy_token *, int, int)"
                     );
      }
      if (td_handle_size == 0) {
        fy_emit_printf(emit,fyewt_tag,"!<%.*s>",tag_len & 0xffffffff,pcVar3);
      }
      else {
        fy_emit_printf(emit,fyewt_tag,"%.*s%.*s",td_handle_size,pcVar2,
                       (ulong)(uint)((int)tag_len - (int)td_prefix_size),pcVar3 + td_prefix_size);
      }
      *(byte *)&emit->flags = (byte)emit->flags & 0xfc;
    }
  }
  if ((((flags & 1U) != 0) && (emit->column != 0)) && ((emit->flags & 8) == 0)) {
    fy_emit_putc(emit,fyewt_linebreak,10);
    emit->flags = 3;
  }
  return;
}

Assistant:

void fy_emit_common_node_preamble(struct fy_emitter *emit,
                                  struct fy_token *fyt_anchor,
                                  struct fy_token *fyt_tag,
                                  int flags, int indent) {
    const char *anchor = NULL;
    const char *tag = NULL;
    const char *td_prefix __FY_DEBUG_UNUSED__;
    const char *td_handle;
    size_t td_prefix_size, td_handle_size;
    size_t tag_len = 0, anchor_len = 0;
    bool json_mode = false;

    json_mode = fy_emit_is_json_mode(emit);

    if (!json_mode) {
        if (!(emit->cfg->flags & FYECF_STRIP_LABELS)) {
            if (fyt_anchor)
                anchor = fy_token_get_text(fyt_anchor, &anchor_len);
        }

        if (!(emit->cfg->flags & FYECF_STRIP_TAGS)) {
            if (fyt_tag)
                tag = fy_token_get_text(fyt_tag, &tag_len);
        }

        if (anchor) {
            fy_emit_write_indicator(emit, di_ambersand, flags, indent, fyewt_anchor);
            fy_emit_write(emit, fyewt_anchor, anchor, anchor_len);
        }

        if (tag) {
            if (!fy_emit_whitespace(emit))
                fy_emit_write_ws(emit);

            td_handle = fy_tag_token_get_directive_handle(fyt_tag, &td_handle_size);
            assert(td_handle);
            td_prefix = fy_tag_token_get_directive_prefix(fyt_tag, &td_prefix_size);
            assert(td_prefix);

            if (!td_handle_size)
                fy_emit_printf(emit, fyewt_tag, "!<%.*s>", (int) tag_len, tag);
            else
                fy_emit_printf(emit, fyewt_tag, "%.*s%.*s",
                               (int) td_handle_size, td_handle,
                               (int) (tag_len - td_prefix_size), tag + td_prefix_size);

            emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION);
        }
    }

    /* content for root always starts on a new line */
    if ((flags & DDNF_ROOT) && emit->column != 0 &&
        !(emit->flags & FYEF_HAD_DOCUMENT_START)) {
        fy_emit_putc(emit, fyewt_linebreak, '\n');
        emit->flags = FYEF_WHITESPACE | FYEF_INDENTATION;
    }
}